

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
* __thiscall
phmap::priv::anon_unknown_0::
unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
::insert(pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
         *__return_storage_ptr__,
        unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
        *this,value_type *x)

{
  size_type sVar1;
  btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
  *pbVar2;
  char *pcVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_long,_long>_>,_bool> pVar4;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  _Base_ptr local_40;
  bool local_38 [8];
  
  sVar1 = (this->
          super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
          ).tree_.
          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
          .
          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
          .
          super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
          .tree_.size_;
  pVar4 = std::
          _Rb_tree<long,std::pair<long_const,long>,std::_Select1st<std::pair<long_const,long>>,std::less<long>,std::allocator<std::pair<long_const,long>>>
          ::_M_insert_unique<std::pair<long_const,long>const&>
                    ((_Rb_tree<long,std::pair<long_const,long>,std::_Select1st<std::pair<long_const,long>>,std::less<long>,std::allocator<std::pair<long_const,long>>>
                      *)&(this->
                         super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                         ).checker_,x);
  local_40 = (_Base_ptr)pVar4.first._M_node;
  local_38[0] = pVar4.second;
  btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
  ::insert_unique<std::pair<long_const,long>const&>
            (__return_storage_ptr__,
             (btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
              *)this,&x->first,x);
  pbVar2 = (__return_storage_ptr__->first).node;
  if (((ulong)pbVar2 & 7) == 0) {
    (anonymous_namespace)::CheckPairEquals<long_const,long,long_const,long>
              ((pair<const_long,_long> *)
               (pbVar2 + (long)(__return_storage_ptr__->first).position * 0x10 + 0x10),
               (pair<const_long,_long> *)(local_40 + 1));
    testing::internal::CmpHelperEQ<bool,bool>
              (local_50,"tree_res.second","checker_res.second",&__return_storage_ptr__->second,
               local_38);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_48->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x160,pcVar3);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    local_60._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (this->
         super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         ).tree_.
         super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
         .
         super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
         .
         super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
         .tree_.size_;
    local_58.data_ =
         (AssertHelperData *)
         (this->
         super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         ).checker_._M_t._M_impl.super__Rb_tree_header._M_node_count;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_50,"this->tree_.size()","this->checker_.size()",(unsigned_long *)&local_60,
               (unsigned_long *)&local_58);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_48->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x161,pcVar3);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    local_60._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (this->
         super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         ).tree_.
         super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
         .
         super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
         .
         super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
         .tree_.size_;
    local_58.data_ = (AssertHelperData *)(sVar1 + __return_storage_ptr__->second);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_50,"this->tree_.size()","size + tree_res.second",(unsigned_long *)&local_60,
               (unsigned_long *)&local_58);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_48->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x162,pcVar3);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
               );
}

Assistant:

std::pair<iterator, bool> insert(const value_type &x) {
            size_t size = this->tree_.size();
            std::pair<typename CheckerType::iterator, bool> checker_res =
                this->checker_.insert(x);
            std::pair<iterator, bool> tree_res = this->tree_.insert(x);
            CheckPairEquals(*tree_res.first, *checker_res.first);
            EXPECT_EQ(tree_res.second, checker_res.second);
            EXPECT_EQ(this->tree_.size(), this->checker_.size());
            EXPECT_EQ(this->tree_.size(), size + tree_res.second);
            return tree_res;
        }